

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkclean.c
# Opt level: O0

void UpdateCues(ebml_master *Cues,ebml_master *Segment)

{
  ebml_master *peVar1;
  err_t eVar2;
  ebml_master *NextCue;
  ebml_master *Cue;
  ebml_master *Segment_local;
  ebml_master *Cues_local;
  
  peVar1 = (ebml_master *)(Cues->Base).Base.Children;
  while( true ) {
    NextCue = peVar1;
    if (NextCue == (ebml_master *)0x0) {
      return;
    }
    if (NextCue == (ebml_master *)(NextCue->Base).Base.Next) break;
    peVar1 = (ebml_master *)(NextCue->Base).Base.Next;
    eVar2 = MATROSKA_CuePointUpdate((matroska_cuepoint *)NextCue,&Segment->Base,DstProfile);
    if (eVar2 != 0) {
      NodeDelete((node *)NextCue);
    }
  }
  __assert_fail("(nodetree*)(Cue) != ((nodetree*)(Cue))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkclean/mkclean.c"
                ,0x158,"void UpdateCues(ebml_master *, ebml_master *)");
}

Assistant:

static void UpdateCues(ebml_master *Cues, ebml_master *Segment)
{
    ebml_master *Cue,*NextCue;

    // reevaluate the size needed for the Cues
    for (Cue=(ebml_master*)EBML_MasterChildren(Cues);Cue;Cue=NextCue)
    {
        NextCue =(ebml_master*)EBML_MasterNext(Cue);
        if (MATROSKA_CuePointUpdate((matroska_cuepoint*)Cue, (ebml_element*)Segment, DstProfile)!=ERR_NONE)
        {
            NodeDelete((node*)Cue);
        }
    }
}